

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall Js::RootObjectVariablesWalker::PopulateMembers(RootObjectVariablesWalker *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ArenaAllocator *alloc;
  undefined4 *puVar5;
  RootObjectBase *this_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  DynamicTypeHandler *pDVar7;
  DebuggerPropertyDisplayInfo *local_58;
  long local_50;
  PropertyRecord *propertyRecord;
  Var value;
  int local_38;
  int index;
  bool isConst;
  
  if (((this->super_ObjectVariablesWalker).super_VariableWalkerBase.pMembersList ==
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     ((this->super_ObjectVariablesWalker).super_VariableWalkerBase.instance != (Var)0x0)) {
    iVar3 = (*((this->super_ObjectVariablesWalker).super_VariableWalkerBase.pFrame)->
              _vptr_DiagStackFrame[10])();
    alloc = GetArenaFromContext((ScriptContext *)CONCAT44(extraout_var,iVar3));
    bVar2 = VarIs<Js::RootObjectBase>
                      ((this->super_ObjectVariablesWalker).super_VariableWalkerBase.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x37f,"(Js::VarIs<Js::RootObjectBase>(instance))",
                                  "Js::VarIs<Js::RootObjectBase>(instance)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    this_00 = VarTo<Js::RootObjectBase>
                        ((this->super_ObjectVariablesWalker).super_VariableWalkerBase.instance);
    local_38 = (*(this_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(this_00);
    pLVar6 = JsUtil::
             List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,local_38);
    (this->super_ObjectVariablesWalker).super_VariableWalkerBase.pMembersList = pLVar6;
    value._4_4_ = 0;
    while( true ) {
      pDVar7 = DynamicObject::GetTypeHandler(&this_00->super_DynamicObject);
      iVar4 = (*pDVar7->_vptr_DynamicTypeHandler[0x25])
                        (pDVar7,(long)&value + 4,this_00,&local_50,&propertyRecord,(long)&index + 3)
      ;
      if ((char)iVar4 == '\0') break;
      if ((PropertyRecord *)
          (((((ScriptContext *)CONCAT44(extraout_var,iVar3))->super_ScriptContextBase).
           javascriptLibrary)->undeclBlockVarSentinel).ptr != propertyRecord) {
        local_58 = VariableWalkerBase::AllocateNewPropertyDisplayInfo
                             ((VariableWalkerBase *)this,*(PropertyId *)(local_50 + 8),
                              propertyRecord,(bool)index._3_1_,false);
        JsUtil::
        List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add((this->super_ObjectVariablesWalker).super_VariableWalkerBase.pMembersList,&local_58);
      }
    }
    ObjectVariablesWalker::AddObjectProperties
              (&this->super_ObjectVariablesWalker,local_38,(RecyclableObject *)this_00);
  }
  return;
}

Assistant:

void RootObjectVariablesWalker::PopulateMembers()
    {
        if (pMembersList == nullptr && instance != nullptr)
        {
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            Assert(Js::VarIs<Js::RootObjectBase>(instance));
            Js::RootObjectBase* object = Js::VarTo<Js::RootObjectBase>(instance);

            int count = object->GetPropertyCount();
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena, count);

            // Add let/const globals first so that they take precedence over the global properties.  Then
            // VariableWalkerBase::FindPropertyAddress will correctly find let/const globals that shadow
            // global properties of the same name.
            object->MapLetConstGlobals([&](const PropertyRecord* propertyRecord, Var value, bool isConst) {
                if (!scriptContext->IsUndeclBlockVar(value))
                {
                    // Let/const are always enumerable and valid
                    DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(propertyRecord->GetPropertyId(), value, isConst, false /*isInDeadZone*/);
                    pMembersList->Add(info);
                }
            });

            AddObjectProperties(count, object);
        }
    }